

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_radix_scatter.cpp
# Opt level: O2

void duckdb::TemplatedRadixScatter<duckdb::interval_t>
               (UnifiedVectorFormat *vdata,SelectionVector *sel,idx_t add_count,
               data_ptr_t *key_locations,bool desc,bool has_null,bool nulls_first,idx_t offset)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  data_ptr_t pdVar3;
  bool bVar4;
  idx_t s;
  ulong uVar5;
  idx_t i;
  idx_t iVar6;
  ulong uVar7;
  undefined3 in_register_00000089;
  idx_t iVar8;
  long lVar9;
  interval_t value;
  interval_t value_00;
  
  pdVar1 = vdata->data;
  if (CONCAT31(in_register_00000089,has_null) == 0) {
    for (uVar7 = 0; uVar7 != add_count; uVar7 = uVar7 + 1) {
      uVar5 = uVar7;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar5 = (ulong)sel->sel_vector[uVar7];
      }
      psVar2 = vdata->sel->sel_vector;
      if (psVar2 != (sel_t *)0x0) {
        uVar5 = (ulong)psVar2[uVar5];
      }
      value_00.micros = (int64_t)psVar2;
      value_00._0_8_ = *(undefined8 *)(pdVar1 + uVar5 * 0x10 + offset * 0x10 + 8);
      Radix::EncodeData<duckdb::interval_t>
                ((Radix *)key_locations[uVar7],
                 *(data_ptr_t *)(pdVar1 + uVar5 * 0x10 + offset * 0x10),value_00);
      if (desc) {
        for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
          key_locations[uVar7][lVar9] = ~key_locations[uVar7][lVar9];
        }
      }
      key_locations[uVar7] = key_locations[uVar7] + 0x10;
    }
  }
  else {
    for (iVar6 = 0; iVar6 != add_count; iVar6 = iVar6 + 1) {
      iVar8 = iVar6;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar8 = (idx_t)sel->sel_vector[iVar6];
      }
      psVar2 = vdata->sel->sel_vector;
      if (psVar2 != (sel_t *)0x0) {
        iVar8 = (idx_t)psVar2[iVar8];
      }
      bVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&(vdata->validity).super_TemplatedValidityMask<unsigned_long>,
                         iVar8 + offset);
      pdVar3 = key_locations[iVar6];
      if (bVar4) {
        *pdVar3 = nulls_first;
        lVar9 = (iVar8 + offset) * 0x10;
        value.micros = (int64_t)pdVar3;
        value._0_8_ = *(undefined8 *)(pdVar1 + lVar9 + 8);
        Radix::EncodeData<duckdb::interval_t>
                  ((Radix *)(key_locations[iVar6] + 1),*(data_ptr_t *)(pdVar1 + lVar9),value);
        if (desc) {
          for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
            key_locations[iVar6][lVar9 + 1] = ~key_locations[iVar6][lVar9 + 1];
          }
        }
      }
      else {
        *pdVar3 = !nulls_first;
        pdVar3 = key_locations[iVar6];
        pdVar3[1] = '\0';
        pdVar3[2] = '\0';
        pdVar3[3] = '\0';
        pdVar3[4] = '\0';
        pdVar3[5] = '\0';
        pdVar3[6] = '\0';
        pdVar3[7] = '\0';
        pdVar3[8] = '\0';
        pdVar3[9] = '\0';
        pdVar3[10] = '\0';
        pdVar3[0xb] = '\0';
        pdVar3[0xc] = '\0';
        pdVar3[0xd] = '\0';
        pdVar3[0xe] = '\0';
        pdVar3[0xf] = '\0';
        pdVar3[0x10] = '\0';
      }
      key_locations[iVar6] = key_locations[iVar6] + 0x11;
    }
  }
  return;
}

Assistant:

void TemplatedRadixScatter(UnifiedVectorFormat &vdata, const SelectionVector &sel, idx_t add_count,
                           data_ptr_t *key_locations, const bool desc, const bool has_null, const bool nulls_first,
                           const idx_t offset) {
	auto source = UnifiedVectorFormat::GetData<T>(vdata);
	if (has_null) {
		auto &validity = vdata.validity;
		const data_t valid = nulls_first ? 1 : 0;
		const data_t invalid = 1 - valid;

		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			// write validity and according value
			if (validity.RowIsValid(source_idx)) {
				key_locations[i][0] = valid;
				Radix::EncodeData<T>(key_locations[i] + 1, source[source_idx]);
				// invert bits if desc
				if (desc) {
					for (idx_t s = 1; s < sizeof(T) + 1; s++) {
						*(key_locations[i] + s) = ~*(key_locations[i] + s);
					}
				}
			} else {
				key_locations[i][0] = invalid;
				memset(key_locations[i] + 1, '\0', sizeof(T));
			}
			key_locations[i] += sizeof(T) + 1;
		}
	} else {
		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			// write value
			Radix::EncodeData<T>(key_locations[i], source[source_idx]);
			// invert bits if desc
			if (desc) {
				for (idx_t s = 0; s < sizeof(T); s++) {
					*(key_locations[i] + s) = ~*(key_locations[i] + s);
				}
			}
			key_locations[i] += sizeof(T);
		}
	}
}